

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O2

void get_msurf_descriptor_haar_unroll_1_1_False(integral_image *iimage,interest_point *ipoint)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int i;
  int iVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  float *pfVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  float *pfVar28;
  int k_count_1;
  int k_count;
  long lVar29;
  ulong uVar30;
  float *pfVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  undefined1 in_ZMM8 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  undefined1 auVar59 [64];
  
  auVar40._8_4_ = 0x3effffff;
  auVar40._0_8_ = 0x3effffff3effffff;
  auVar40._12_4_ = 0x3effffff;
  auVar39._8_4_ = 0x80000000;
  auVar39._0_8_ = 0x8000000080000000;
  auVar39._12_4_ = 0x80000000;
  fVar47 = ipoint->scale;
  auVar59 = ZEXT464((uint)fVar47);
  auVar41 = ZEXT416((uint)fVar47);
  auVar32 = vpternlogd_avx512vl(auVar40,auVar41,auVar39,0xf8);
  auVar32 = ZEXT416((uint)(fVar47 + auVar32._0_4_));
  auVar32 = vroundss_avx(auVar32,auVar32,0xb);
  fVar44 = -0.08 / (fVar47 * fVar47);
  iVar22 = (int)auVar32._0_4_;
  auVar33._0_4_ = (int)auVar32._0_4_;
  auVar33._4_4_ = (int)auVar32._4_4_;
  auVar33._8_4_ = (int)auVar32._8_4_;
  auVar33._12_4_ = (int)auVar32._12_4_;
  auVar32 = vcvtdq2ps_avx(auVar33);
  auVar33 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)ipoint->x),auVar39,0xf8);
  auVar33 = ZEXT416((uint)(ipoint->x + auVar33._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  auVar34._0_8_ = (double)auVar33._0_4_;
  auVar34._8_8_ = auVar33._8_8_;
  auVar38._0_8_ = (double)fVar47;
  auVar38._8_8_ = 0;
  auVar33 = vfmadd231sd_fma(auVar34,auVar38,ZEXT816(0x3fe0000000000000));
  auVar37._0_4_ = (float)auVar33._0_8_;
  auVar37._4_12_ = auVar33._4_12_;
  auVar33 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)ipoint->y),auVar39,0xf8);
  fVar3 = auVar37._0_4_ - auVar32._0_4_;
  auVar33 = ZEXT416((uint)(ipoint->y + auVar33._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  auVar35._0_8_ = (double)auVar33._0_4_;
  auVar35._8_8_ = auVar33._8_8_;
  auVar33 = vfmadd231sd_fma(auVar35,auVar38,ZEXT816(0x3fe0000000000000));
  auVar36._0_4_ = (float)auVar33._0_8_;
  auVar36._4_12_ = auVar33._4_12_;
  fVar58 = auVar36._0_4_ - auVar32._0_4_;
  auVar34 = ZEXT416((uint)fVar47);
  auVar32 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar34,auVar37);
  auVar33 = vpternlogd_avx512vl(auVar40,auVar32,auVar39,0xf8);
  auVar32 = ZEXT416((uint)(auVar32._0_4_ + auVar33._0_4_));
  auVar32 = vroundss_avx(auVar32,auVar32,0xb);
  if (iVar22 < (int)auVar32._0_4_) {
    auVar42._8_4_ = 0x3effffff;
    auVar42._0_8_ = 0x3effffff3effffff;
    auVar42._12_4_ = 0x3effffff;
    auVar43._8_4_ = 0x80000000;
    auVar43._0_8_ = 0x8000000080000000;
    auVar43._12_4_ = 0x80000000;
    auVar32 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar34,auVar36);
    auVar33 = vpternlogd_avx512vl(auVar43,auVar32,auVar42,0xea);
    auVar32 = ZEXT416((uint)(auVar32._0_4_ + auVar33._0_4_));
    auVar32 = vroundss_avx(auVar32,auVar32,0xb);
    if (iVar22 < (int)auVar32._0_4_) {
      auVar32 = vfmadd231ss_fma(auVar37,auVar34,ZEXT416(0x41300000));
      auVar53._8_4_ = 0x80000000;
      auVar53._0_8_ = 0x8000000080000000;
      auVar53._12_4_ = 0x80000000;
      auVar33 = vpternlogd_avx512vl(auVar53,auVar32,auVar42,0xea);
      auVar32 = ZEXT416((uint)(auVar32._0_4_ + auVar33._0_4_));
      auVar32 = vroundss_avx(auVar32,auVar32,0xb);
      if ((int)auVar32._0_4_ + iVar22 <= iimage->width) {
        auVar32 = vfmadd231ss_fma(auVar36,auVar34,ZEXT416(0x41300000));
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar33 = vpternlogd_avx512vl(auVar42,auVar32,auVar13,0xf8);
        auVar32 = ZEXT416((uint)(auVar32._0_4_ + auVar33._0_4_));
        auVar32 = vroundss_avx(auVar32,auVar32,0xb);
        if ((int)auVar32._0_4_ + iVar22 <= iimage->height) {
          iVar15 = -0xc;
          lVar21 = 0;
          for (lVar17 = 0; lVar17 != 0x18; lVar17 = lVar17 + 1) {
            auVar32._0_4_ = (float)iVar15;
            auVar32._4_12_ = in_ZMM8._4_12_;
            auVar32 = vfmadd213ss_fma(auVar32,auVar59._0_16_,ZEXT416((uint)(fVar58 + 0.5)));
            lVar20 = lVar21;
            for (lVar29 = 0; lVar29 != 0x18; lVar29 = lVar29 + 1) {
              auVar50._0_4_ = (float)((int)lVar29 + -0xc);
              auVar50._4_12_ = in_ZMM8._4_12_;
              auVar33 = vfmadd132ss_fma(auVar50,ZEXT416((uint)(fVar3 + 0.5)),ZEXT416((uint)fVar47));
              haarXY_unconditional
                        (iimage,(int)auVar32._0_4_,(int)auVar33._0_4_,iVar22,
                         (float *)((long)haarResponseX + lVar20),
                         (float *)((long)haarResponseY + lVar20));
              lVar20 = lVar20 + 4;
            }
            auVar59 = ZEXT1664(auVar41);
            iVar15 = iVar15 + 1;
            lVar21 = lVar21 + 0x60;
          }
          goto LAB_0015a6ea;
        }
      }
    }
  }
  iVar15 = -0xc;
  lVar21 = 0;
  for (lVar17 = 0; lVar17 != 0x18; lVar17 = lVar17 + 1) {
    auVar48._0_4_ = (float)iVar15;
    auVar48._4_12_ = in_ZMM8._4_12_;
    auVar32 = vfmadd213ss_fma(auVar48,auVar59._0_16_,ZEXT416((uint)fVar58));
    fVar45 = auVar32._0_4_;
    lVar20 = lVar21;
    for (lVar29 = 0; lVar29 != 0x18; lVar29 = lVar29 + 1) {
      auVar49._0_4_ = (float)((int)lVar29 + -0xc);
      auVar49._4_12_ = in_ZMM8._4_12_;
      auVar32 = vfmadd132ss_fma(auVar49,ZEXT416((uint)fVar3),ZEXT416((uint)fVar47));
      fVar46 = auVar32._0_4_;
      haarXY_precheck_boundaries
                (iimage,(int)((double)((ulong)(0.0 <= fVar45) * 0x3fe0000000000000 +
                                      (ulong)(0.0 > fVar45) * -0x4020000000000000) + (double)fVar45)
                 ,(int)((double)((ulong)(0.0 <= fVar46) * 0x3fe0000000000000 +
                                (ulong)(0.0 > fVar46) * -0x4020000000000000) + (double)fVar46),
                 iVar22,(float *)((long)haarResponseX + lVar20),
                 (float *)((long)haarResponseY + lVar20));
      lVar20 = lVar20 + 4;
    }
    auVar59 = ZEXT1664(auVar41);
    iVar15 = iVar15 + 1;
    lVar21 = lVar21 + 0x60;
  }
LAB_0015a6ea:
  fVar58 = auVar59._0_4_;
  auVar57._8_4_ = 0x3effffff;
  auVar57._0_8_ = 0x3effffff3effffff;
  auVar57._12_4_ = 0x3effffff;
  auVar56._8_4_ = 0x80000000;
  auVar56._0_8_ = 0x8000000080000000;
  auVar56._12_4_ = 0x80000000;
  auVar32 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)(fVar58 * 0.5)),auVar56,0xf8);
  auVar32 = ZEXT416((uint)(fVar58 * 0.5 + auVar32._0_4_));
  auVar32 = vroundss_avx(auVar32,auVar32,0xb);
  auVar33 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)(fVar58 * 1.5)),auVar56,0xf8);
  auVar33 = ZEXT416((uint)(fVar58 * 1.5 + auVar33._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  auVar34 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)(fVar58 * 2.5)),auVar56,0xf8);
  auVar34 = ZEXT416((uint)(fVar58 * 2.5 + auVar34._0_4_));
  auVar34 = vroundss_avx(auVar34,auVar34,0xb);
  auVar35 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)(fVar58 * 3.5)),auVar56,0xf8);
  auVar35 = ZEXT416((uint)(fVar58 * 3.5 + auVar35._0_4_));
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  auVar36 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)(fVar58 * 4.5)),auVar56,0xf8);
  auVar36 = ZEXT416((uint)(fVar58 * 4.5 + auVar36._0_4_));
  auVar36 = vroundss_avx(auVar36,auVar36,0xb);
  auVar37 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)(fVar58 * 5.5)),auVar56,0xf8);
  auVar37 = ZEXT416((uint)(fVar58 * 5.5 + auVar37._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  auVar38 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)(fVar58 * 6.5)),auVar56,0xf8);
  auVar38 = ZEXT416((uint)(fVar58 * 6.5 + auVar38._0_4_));
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  auVar39 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)(fVar58 * 7.5)),auVar56,0xf8);
  auVar39 = ZEXT416((uint)(auVar39._0_4_ + fVar58 * 7.5));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar40 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)(fVar58 * 8.5)),auVar56,0xf8);
  auVar40 = ZEXT416((uint)(fVar58 * 8.5 + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar41 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)(fVar58 * 9.5)),auVar56,0xf8);
  auVar41 = ZEXT416((uint)(fVar58 * 9.5 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)(fVar58 * 10.5)),auVar56,0xf8);
  auVar42 = ZEXT416((uint)(fVar58 * 10.5 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)(fVar58 * 11.5)),auVar56,0xf8);
  fVar51 = auVar34._0_4_;
  fVar47 = fVar51 + auVar33._0_4_;
  fVar3 = fVar51 + auVar32._0_4_;
  auVar34 = ZEXT416((uint)(fVar58 * 11.5 + auVar43._0_4_));
  auVar34 = vroundss_avx(auVar34,auVar34,0xb);
  fVar58 = fVar51 - auVar32._0_4_;
  fVar45 = fVar51 - auVar33._0_4_;
  fVar46 = fVar51 - auVar35._0_4_;
  fVar4 = fVar51 - auVar36._0_4_;
  fVar5 = fVar51 - auVar37._0_4_;
  fVar51 = fVar51 - auVar38._0_4_;
  fVar55 = auVar39._0_4_;
  fVar6 = fVar55 - auVar35._0_4_;
  fVar7 = fVar55 - auVar36._0_4_;
  fVar8 = fVar55 - auVar37._0_4_;
  fVar9 = fVar55 - auVar38._0_4_;
  fVar10 = fVar55 - auVar40._0_4_;
  fVar11 = fVar55 - auVar41._0_4_;
  fVar12 = fVar55 - auVar42._0_4_;
  fVar55 = fVar55 - auVar34._0_4_;
  gauss_s1_c0[0] = expf(fVar47 * fVar47 * fVar44);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar44);
  gauss_s1_c0[2] = expf(fVar58 * fVar58 * fVar44);
  gauss_s1_c0[3] = expf(fVar45 * fVar45 * fVar44);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar46 * fVar46 * fVar44);
  gauss_s1_c0[6] = expf(fVar4 * fVar4 * fVar44);
  gauss_s1_c0[7] = expf(fVar5 * fVar5 * fVar44);
  gauss_s1_c0[8] = expf(fVar51 * fVar51 * fVar44);
  gauss_s1_c1[0] = expf(fVar6 * fVar6 * fVar44);
  gauss_s1_c1[1] = expf(fVar7 * fVar7 * fVar44);
  gauss_s1_c1[2] = expf(fVar8 * fVar8 * fVar44);
  gauss_s1_c1[3] = expf(fVar9 * fVar9 * fVar44);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar10 * fVar10 * fVar44);
  gauss_s1_c1[6] = expf(fVar11 * fVar11 * fVar44);
  gauss_s1_c1[7] = expf(fVar12 * fVar12 * fVar44);
  gauss_s1_c1[8] = expf(fVar55 * fVar55 * fVar44);
  auVar59 = ZEXT1264(ZEXT812(0));
  lVar17 = 0;
  auVar41._8_4_ = 0x7fffffff;
  auVar41._0_8_ = 0x7fffffff7fffffff;
  auVar41._12_4_ = 0x7fffffff;
  iVar22 = 0;
  lVar21 = 0;
  uVar19 = 0xfffffffffffffff8;
  while (uVar16 = (uint)uVar19, (int)uVar16 < 8) {
    pfVar23 = gauss_s1_c1;
    if (uVar16 != 7) {
      pfVar23 = gauss_s1_c0;
    }
    lVar20 = (long)iVar22;
    lVar21 = (long)(int)lVar21;
    iVar22 = iVar22 + 4;
    if (uVar16 == 0xfffffff8) {
      pfVar23 = gauss_s1_c1;
    }
    uVar30 = 0;
    uVar26 = 0xfffffffffffffff8;
    lVar29 = lVar17;
    while (lVar20 != iVar22) {
      pfVar31 = gauss_s1_c1;
      iVar15 = (int)uVar26;
      if (iVar15 != 7) {
        pfVar31 = gauss_s1_c0;
      }
      auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar26 = (ulong)((uint)(uVar26 >> 0x1c) & 8);
      if (iVar15 == -8) {
        pfVar31 = gauss_s1_c1;
      }
      lVar24 = (long)haarResponseX + lVar29;
      lVar25 = (long)haarResponseY + lVar29;
      for (uVar18 = uVar30; uVar18 < iVar15 * 0x18 + 0x198; uVar18 = uVar18 + 0x18) {
        lVar27 = 0;
        pfVar28 = (float *)((long)pfVar23 + (ulong)(((uint)(uVar19 >> 0x1f) & 1) << 5));
        while (lVar27 != 9) {
          fVar47 = *pfVar28;
          pfVar28 = pfVar28 + (ulong)(~uVar16 >> 0x1f) * 2 + -1;
          lVar1 = lVar27 * 4;
          lVar2 = lVar27 * 4;
          lVar27 = lVar27 + 1;
          auVar34 = ZEXT416((uint)(pfVar31[uVar26] * fVar47 * *(float *)(lVar24 + lVar2)));
          auVar32 = vandps_avx(auVar34,auVar41);
          auVar35 = ZEXT416((uint)(pfVar31[uVar26] * fVar47 * *(float *)(lVar25 + lVar1)));
          auVar33 = vandps_avx(auVar35,auVar41);
          auVar34 = vinsertps_avx(auVar35,auVar34,0x10);
          auVar33 = vmovlhps_avx(auVar34,auVar33);
          auVar32 = vinsertps_avx(auVar33,auVar32,0x30);
          auVar52 = ZEXT1664(CONCAT412(auVar52._12_4_ + auVar32._12_4_,
                                       CONCAT48(auVar52._8_4_ + auVar32._8_4_,
                                                CONCAT44(auVar52._4_4_ + auVar32._4_4_,
                                                         auVar52._0_4_ + auVar32._0_4_))));
        }
        uVar26 = uVar26 + (ulong)(-1 < iVar15) * 2 + -1;
        lVar24 = lVar24 + 0x60;
        lVar25 = lVar25 + 0x60;
      }
      uVar26 = (ulong)(iVar15 + 5);
      uVar30 = uVar30 + 0x78;
      lVar29 = lVar29 + 0x1e0;
      fVar47 = gauss_s2_arr[lVar20];
      auVar14._4_4_ = fVar47;
      auVar14._0_4_ = fVar47;
      auVar14._8_4_ = fVar47;
      auVar14._12_4_ = fVar47;
      auVar35 = vmulps_avx512vl(auVar52._0_16_,auVar14);
      lVar20 = lVar20 + 1;
      auVar54._0_4_ = auVar35._0_4_ * auVar35._0_4_;
      auVar54._4_4_ = auVar35._4_4_ * auVar35._4_4_;
      auVar54._8_4_ = auVar35._8_4_ * auVar35._8_4_;
      auVar54._12_4_ = auVar35._12_4_ * auVar35._12_4_;
      auVar33 = vshufpd_avx(auVar35,auVar35,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar21) = auVar35;
      lVar21 = lVar21 + 4;
      auVar32 = vmovshdup_avx(auVar54);
      auVar34 = vfmadd231ss_fma(auVar32,auVar35,auVar35);
      auVar32 = vshufps_avx(auVar35,auVar35,0xff);
      auVar33 = vfmadd213ss_fma(auVar33,auVar33,auVar34);
      auVar32 = vfmadd213ss_fma(auVar32,auVar32,auVar33);
      auVar59 = ZEXT464((uint)(auVar59._0_4_ + auVar32._0_4_));
    }
    lVar17 = lVar17 + 0x14;
    uVar19 = (ulong)(uVar16 + 5);
  }
  if (auVar59._0_4_ < 0.0) {
    fVar47 = sqrtf(auVar59._0_4_);
  }
  else {
    auVar32 = vsqrtss_avx(auVar59._0_16_,auVar59._0_16_);
    fVar47 = auVar32._0_4_;
  }
  for (lVar17 = 0; lVar17 != 0x40; lVar17 = lVar17 + 1) {
    ipoint->descriptor[lVar17] = (1.0 / fVar47) * ipoint->descriptor[lVar17];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_1_1_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}